

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextBase.hpp
# Opt level: O0

void __thiscall
Diligent::DeviceContextBase<Diligent::EngineVkImplTraits>::MapTextureSubresource
          (DeviceContextBase<Diligent::EngineVkImplTraits> *this,ITexture *pTexture,Uint32 MipLevel,
          Uint32 ArraySlice,MAP_TYPE MapType,MAP_FLAGS MapFlags,Box *pMapRegion,
          MappedTextureSubresource *MappedData)

{
  int iVar1;
  Char *Message;
  undefined4 extraout_var;
  undefined1 local_48 [8];
  string msg;
  MAP_FLAGS MapFlags_local;
  MAP_TYPE MapType_local;
  Uint32 ArraySlice_local;
  Uint32 MipLevel_local;
  ITexture *pTexture_local;
  DeviceContextBase<Diligent::EngineVkImplTraits> *this_local;
  
  msg.field_2._M_local_buf[0xe] = MapFlags;
  msg.field_2._M_local_buf[0xf] = MapType;
  if (pTexture == (ITexture *)0x0) {
    FormatString<char[26]>((string *)local_48,(char (*) [26])0xcc4a60);
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"MapTextureSubresource",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x754);
    std::__cxx11::string::~string((string *)local_48);
  }
  iVar1 = (*(pTexture->super_IDeviceObject).super_IObject._vptr_IObject[4])();
  ValidateMapTextureParams
            ((TextureDesc *)CONCAT44(extraout_var,iVar1),MipLevel,ArraySlice,
             msg.field_2._M_local_buf[0xf],(uint)(byte)msg.field_2._M_local_buf[0xe],pMapRegion);
  (this->m_Stats).CommandCounters.MapTextureSubresource =
       (this->m_Stats).CommandCounters.MapTextureSubresource + 1;
  return;
}

Assistant:

inline void DeviceContextBase<ImplementationTraits>::MapTextureSubresource(
    ITexture*                 pTexture,
    Uint32                    MipLevel,
    Uint32                    ArraySlice,
    MAP_TYPE                  MapType,
    MAP_FLAGS                 MapFlags,
    const Box*                pMapRegion,
    MappedTextureSubresource& MappedData)
{
    DEV_CHECK_ERR(pTexture, "pTexture must not be null");
    ValidateMapTextureParams(pTexture->GetDesc(), MipLevel, ArraySlice, MapType, MapFlags, pMapRegion);
    ++m_Stats.CommandCounters.MapTextureSubresource;
}